

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

void __thiscall IsoWriter::writePrimaryVolumeDescriptor(IsoWriter *this)

{
  uint8_t *buffer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *value;
  ulong uVar3;
  long *plVar4;
  long *plVar5;
  size_type *__n;
  uint32_t *buff32;
  string volumeSetIdentifier;
  string volId;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  buffer = this->m_buffer;
  memset(buffer,0,0x800);
  value = (this->m_volumeLabel)._M_dataplus._M_p;
  uVar3 = (this->m_file).m_pos;
  iVar2 = this->m_tagLocationBaseAddr;
  this->m_buffer[0] = '\x01';
  this->m_buffer[1] = '\0';
  this->m_buffer[2] = '\x03';
  this->m_buffer[3] = '\0';
  this->m_buffer[6] = '\x01';
  this->m_buffer[7] = '\0';
  *(int *)(this->m_buffer + 0xc) = (int)(uVar3 >> 0xb) - iVar2;
  this->m_buffer[0x14] = '\0';
  this->m_buffer[0x15] = '\0';
  this->m_buffer[0x16] = '\0';
  this->m_buffer[0x17] = '\0';
  anon_unknown.dwarf_1250c1::writeDString(this->m_buffer + 0x18,value,0x20);
  this->m_buffer[0x38] = '\x01';
  this->m_buffer[0x39] = '\0';
  this->m_buffer[0x3a] = '\x01';
  this->m_buffer[0x3b] = '\0';
  this->m_buffer[0x3c] = '\x02';
  this->m_buffer[0x3d] = '\0';
  this->m_buffer[0x3e] = '\x02';
  this->m_buffer[0x3f] = '\0';
  this->m_buffer[0x40] = '\x01';
  this->m_buffer[0x41] = '\0';
  this->m_buffer[0x42] = '\0';
  this->m_buffer[0x43] = '\0';
  this->m_buffer[0x44] = '\x01';
  this->m_buffer[0x45] = '\0';
  this->m_buffer[0x46] = '\0';
  this->m_buffer[0x47] = '\0';
  int32uToHex_abi_cxx11_(&local_b0,&this->m_volumeId);
  strToUpperCase(&local_90,&local_b0);
  paVar1 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  strPadLeft(&local_b0,&local_90,8,'0');
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"        ","");
  plVar4 = (long *)std::__cxx11::string::replace
                             ((ulong)local_50,0,(char *)0x0,(ulong)local_90._M_dataplus._M_p);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(this->m_volumeLabel)._M_dataplus._M_p);
  __n = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__n) {
    local_b0.field_2._M_allocated_capacity = *__n;
    local_b0.field_2._8_8_ = plVar4[3];
    local_b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *__n;
    local_b0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_b0._M_string_length = plVar4[1];
  *plVar4 = (long)__n;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  anon_unknown.dwarf_1250c1::writeDString(this->m_buffer + 0x48,local_b0._M_dataplus._M_p,0x80);
  this->m_buffer[200] = '\0';
  this->m_buffer[0xc9] = 'O';
  this->m_buffer[0xca] = 'S';
  this->m_buffer[0xcb] = 'T';
  this->m_buffer[0xcc] = 'A';
  this->m_buffer[0xcd] = ' ';
  this->m_buffer[0xce] = 'C';
  this->m_buffer[0xcf] = 'o';
  this->m_buffer[0xd0] = 'm';
  this->m_buffer[0xd1] = 'p';
  this->m_buffer[0xd2] = 'r';
  this->m_buffer[0xd3] = 'e';
  this->m_buffer[0xd4] = 's';
  this->m_buffer[0xd5] = 's';
  this->m_buffer[0xd6] = 'e';
  this->m_buffer[0xd7] = 'd';
  this->m_buffer[0xd8] = ' ';
  this->m_buffer[0xd9] = 'U';
  this->m_buffer[0xda] = 'n';
  this->m_buffer[0xdb] = 'i';
  this->m_buffer[0xdc] = 'c';
  this->m_buffer[0xdd] = 'o';
  this->m_buffer[0xde] = 'd';
  this->m_buffer[0xdf] = 'e';
  this->m_buffer[0xe0] = '\0';
  this->m_buffer[0x108] = '\0';
  this->m_buffer[0x109] = 'O';
  this->m_buffer[0x10a] = 'S';
  this->m_buffer[0x10b] = 'T';
  this->m_buffer[0x10c] = 'A';
  this->m_buffer[0x10d] = ' ';
  this->m_buffer[0x10e] = 'C';
  this->m_buffer[0x10f] = 'o';
  this->m_buffer[0x110] = 'm';
  this->m_buffer[0x111] = 'p';
  this->m_buffer[0x112] = 'r';
  this->m_buffer[0x113] = 'e';
  this->m_buffer[0x114] = 's';
  this->m_buffer[0x115] = 's';
  this->m_buffer[0x116] = 'e';
  this->m_buffer[0x117] = 'd';
  this->m_buffer[0x118] = ' ';
  this->m_buffer[0x119] = 'U';
  this->m_buffer[0x11a] = 'n';
  this->m_buffer[0x11b] = 'i';
  this->m_buffer[0x11c] = 'c';
  this->m_buffer[0x11d] = 'o';
  this->m_buffer[0x11e] = 'd';
  this->m_buffer[0x11f] = 'e';
  this->m_buffer[0x120] = '\0';
  this->m_buffer[0x158] = '\0';
  strcpy((char *)(this->m_buffer + 0x159),(this->m_appId)._M_dataplus._M_p);
  anon_unknown.dwarf_1250c1::writeTimestamp(this->m_buffer + 0x178,this->m_currentTime);
  this->m_buffer[0x184] = '\0';
  strcpy((char *)(this->m_buffer + 0x185),(this->m_impId)._M_dataplus._M_p);
  strcpy((char *)(this->m_buffer + 0x1a4),(this->m_appId)._M_dataplus._M_p);
  this->m_buffer[0x1e8] = '\x01';
  anon_unknown.dwarf_1250c1::calcDescriptorCRC(buffer,0x200);
  File::write(&this->m_file,(int)buffer,(void *)0x800,(size_t)__n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void IsoWriter::writePrimaryVolumeDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));

    ByteFileWriter writer;
    writer.setBuffer(m_buffer, sizeof(m_buffer));
    writer.writeDescriptorTag(DescriptorTag::PrimVol, absoluteSectorNum());

    writer.writeLE32(0x00);  // Volume Descriptor Sequence Number
    writer.writeLE32(0x00);  // Primary Volume Descriptor Number
    writer.writeDString(m_volumeLabel, 32);

    writer.writeLE16(0x01);  // Volume Sequence Number
    writer.writeLE16(0x01);  // Maximum Volume Sequence Number
    writer.writeLE16(0x02);  // Interchange Level
    writer.writeLE16(0x02);  // Maximum Interchange Level
    writer.writeLE32(0x01);  // Character Set List
    writer.writeLE32(0x01);  // Maximum Character Set List

    std::string volId = strToUpperCase(int32uToHex(m_volumeId));
    volId = strPadLeft(volId, 8, '0');
    const std::string volumeSetIdentifier = volId + std::string("        ") + m_volumeLabel;
    writer.writeDString(volumeSetIdentifier.c_str(), 128);

    // Descriptor Character Set
    m_buffer[200] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 201, "OSTA Compressed Unicode");

    // Explanatory Character Set
    m_buffer[264] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 265, "OSTA Compressed Unicode");

    // skip Volume Abstract
    // skip Volume Copyright Notice

    // Application Identifier
    m_buffer[344] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 345, m_appId.c_str());

    writeTimestamp(m_buffer + 376, m_currentTime);  // timestamp

    // Implementation Identifier
    m_buffer[388] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 389, m_impId.c_str());

    strcpy(reinterpret_cast<char *>(m_buffer) + 420, m_appId.c_str());

    // skip Predecessor Volume Descriptor Sequence Location (BP 484) = 0L
    m_buffer[488] = 1;  // Flags (BP 488)

    // 490..511 Reserved

    calcDescriptorCRC(m_buffer, 512);
    m_file.write(m_buffer, SECTOR_SIZE);
}